

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall el::base::Writer::triggerDispatch(Writer *this)

{
  pointer pcVar1;
  Level level;
  LineNumber line;
  Logger *pLVar2;
  char *__s;
  byte bVar3;
  size_t sVar4;
  ostream *poVar5;
  stringstream reasonStream;
  allocator<char> local_27a;
  allocator<char> local_279;
  string local_278;
  string local_258;
  undefined1 local_238 [88];
  Logger *pLStack_1e0;
  _Alloc_hider local_1d8;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  undefined1 local_1b8 [16];
  _Alloc_hider local_1a8;
  size_type sStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  Logger *local_188;
  _Alloc_hider local_180;
  undefined1 local_178 [16];
  undefined4 uStack_168;
  undefined4 uStack_164;
  pointer local_160;
  Logger *pLStack_158;
  _Alloc_hider local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  DispatchAction local_130;
  
  if (this->m_proceed == true) {
    level = this->m_level;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,this->m_file,&local_279)
    ;
    line = this->m_line;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,this->m_func,&local_27a)
    ;
    LogMessage::LogMessage
              ((LogMessage *)local_238,level,&local_258,line,&local_278,this->m_verboseLevel,
               this->m_logger);
    local_130 = this->m_dispatchAction;
    local_1b8[0] = true;
    local_1b8._8_4_ = local_238._0_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._8_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_238 + 0x18)) {
      local_198._8_8_ = local_238._32_8_;
      local_1a8._M_p = (pointer)&local_198;
    }
    else {
      local_1a8._M_p = (pointer)local_238._8_8_;
    }
    local_198._M_allocated_capacity._1_7_ = local_238._25_7_;
    local_198._M_local_buf[0] = local_238[0x18];
    pcVar1 = local_238 + 0x40;
    sStack_1a0 = local_238._16_8_;
    local_238._16_8_ = 0;
    local_238[0x18] = '\0';
    local_188 = (Logger *)local_238._40_8_;
    if ((pointer)local_238._48_8_ == pcVar1) {
      _uStack_168 = local_238._72_8_;
      local_180._M_p = local_178 + 8;
    }
    else {
      local_180._M_p = (pointer)local_238._48_8_;
    }
    local_178._9_7_ = local_238._65_7_;
    local_178[8] = local_238[0x40];
    local_178._0_8_ = local_238._56_8_;
    local_238._56_8_ = (Logger *)0x0;
    local_238[0x40] = '\0';
    local_160 = (pointer)local_238._80_8_;
    pLStack_158 = pLStack_1e0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_p == &local_1c8) {
      local_140._8_8_ = local_1c8._8_8_;
      local_150._M_p = (pointer)&local_140;
    }
    else {
      local_150._M_p = local_1d8._M_p;
    }
    local_140._M_allocated_capacity._1_7_ = local_1c8._M_allocated_capacity._1_7_;
    local_140._M_local_buf[0] = local_1c8._M_local_buf[0];
    local_148 = local_1d0;
    local_1d0 = 0;
    local_1c8._M_local_buf[0] = '\0';
    local_238._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_238 + 0x18);
    local_238._48_8_ = pcVar1;
    local_1d8._M_p = (pointer)&local_1c8;
    LogDispatcher::dispatch((LogDispatcher *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_p != &local_140) {
      operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
    }
    if (local_180._M_p != local_178 + 8) {
      operator_delete(local_180._M_p,local_178._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_p != &local_198) {
      operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_p != &local_1c8) {
      operator_delete(local_1d8._M_p,
                      CONCAT71(local_1c8._M_allocated_capacity._1_7_,local_1c8._M_local_buf[0]) + 1)
      ;
    }
    if ((pointer)local_238._48_8_ != pcVar1) {
      operator_delete((void *)local_238._48_8_,CONCAT71(local_238._65_7_,local_238[0x40]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_238 + 0x18)) {
      operator_delete((void *)local_238._8_8_,CONCAT71(local_238._25_7_,local_238[0x18]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
  }
  pLVar2 = this->m_logger;
  if (pLVar2 != (Logger *)0x0) {
    local_1b8._0_8_ = &local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"");
    std::__cxx11::stringbuf::str((string *)&pLVar2->field_0x58);
    if ((_Alloc_hider *)local_1b8._0_8_ != &local_1a8) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_p + 1));
    }
    (*(this->m_logger->super_ThreadSafe)._vptr_ThreadSafe[1])();
  }
  if (((this->m_proceed == true) && (this->m_level == Fatal)) &&
     ((*(byte *)(elStorage + 0x20) & 8) == 0)) {
    local_1a8._M_p = this->m_file;
    sStack_1a0 = this->m_line;
    local_198._M_allocated_capacity = (size_type)this->m_func;
    local_1b8._0_8_ = &PTR__Writer_001f54f0;
    local_1b8._8_4_ = Warning;
    local_198._8_8_ = local_198._8_8_ & 0xffffffffffff0000;
    local_188 = (Logger *)0x0;
    local_180._M_p = local_180._M_p & 0xffffffffffffff00;
    local_178._0_8_ = (Logger *)0x0;
    local_178._8_8_ =
         (long)"All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n" +
         0x4d;
    uStack_168 = 2;
    local_160 = (pointer)0x0;
    pLStack_158 = (Logger *)0x0;
    local_150._M_p = (pointer)0x0;
    construct((Writer *)local_1b8,1,"default");
    if ((bool)(byte)local_180._M_p == true) {
      MessageBuilder::operator<<
                ((MessageBuilder *)local_178,"Aborting application. Reason: Fatal log at [");
    }
    bVar3 = (byte)local_180._M_p;
    if (((byte)local_180._M_p & 1) != 0) {
      MessageBuilder::operator<<((MessageBuilder *)local_178,this->m_file);
      bVar3 = (byte)local_180._M_p;
    }
    if ((bVar3 & 1) != 0) {
      MessageBuilder::operator<<((MessageBuilder *)local_178,":");
      bVar3 = (byte)local_180._M_p;
    }
    if ((bVar3 & 1) != 0) {
      MessageBuilder::operator<<((MessageBuilder *)local_178,this->m_line);
      bVar3 = (byte)local_180._M_p;
    }
    if ((bVar3 & 1) != 0) {
      MessageBuilder::operator<<((MessageBuilder *)local_178,"]");
    }
    ~Writer((Writer *)local_1b8);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Fatal log at [",0xe);
    __s = this->m_file;
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostream *)&local_1a8 + (int)*(undefined8 *)(local_1a8._M_p + -0x18));
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," If you wish to disable \'abort on fatal log\' please use ",0x38);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"el::Helpers::addFlag(el::LoggingFlag::DisableApplicationAbortOnFatalLog)",
               0x48);
    std::__cxx11::stringbuf::str();
    abort();
  }
  this->m_proceed = false;
  return;
}

Assistant:

void Writer::triggerDispatch(void) {
  if (m_proceed) {
    base::LogDispatcher(m_proceed, LogMessage(m_level, m_file, m_line, m_func, m_verboseLevel,
                        m_logger), m_dispatchAction).dispatch();
  }
  if (m_logger != nullptr) {
    m_logger->stream().str(ELPP_LITERAL(""));
    m_logger->releaseLock();
  }
  if (m_proceed && m_level == Level::Fatal
      && !ELPP->hasFlag(LoggingFlag::DisableApplicationAbortOnFatalLog)) {
    base::Writer(Level::Warning, m_file, m_line, m_func).construct(1, base::consts::kDefaultLoggerId)
        << "Aborting application. Reason: Fatal log at [" << m_file << ":" << m_line << "]";
    std::stringstream reasonStream;
    reasonStream << "Fatal log at [" << m_file << ":" << m_line << "]"
                 << " If you wish to disable 'abort on fatal log' please use "
                 << "el::Helpers::addFlag(el::LoggingFlag::DisableApplicationAbortOnFatalLog)";
    base::utils::abort(1, reasonStream.str());
  }
  m_proceed = false;
}